

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O3

char * __thiscall
tinyxml2::XMLNode::ParseDeep(XMLNode *this,char *p,StrPair *parentEndTag,int *curLineNumPtr)

{
  XMLDocument *this_00;
  XMLNode *node_00;
  int iVar1;
  XMLDocument *pXVar2;
  char *pcVar3;
  undefined4 extraout_var;
  long *plVar4;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  long lVar5;
  char *__s2;
  int iVar6;
  XMLNode *node;
  StrPair local_60;
  XMLNode *local_48;
  char *local_40;
  int *local_38;
  undefined4 extraout_var_00;
  
  this_00 = this->_document;
  iVar6 = this_00->_parsingDepth + 1;
  this_00->_parsingDepth = iVar6;
  pXVar2 = this_00;
  local_38 = curLineNumPtr;
  if (iVar6 == 100) {
    XMLDocument::SetError
              (this_00,XML_ELEMENT_DEPTH_EXCEEDED,this_00->_parseCurLineNum,
               "Element nesting is too deep.");
    pXVar2 = this->_document;
  }
  if (pXVar2->_errorID == XML_SUCCESS) {
    do {
      if ((p == (char *)0x0) || (*p == '\0')) goto LAB_0011805f;
      local_48 = (XMLNode *)0x0;
      pcVar3 = XMLDocument::Identify(this->_document,p,&local_48);
      node_00 = local_48;
      if (local_48 == (XMLNode *)0x0) goto LAB_0011805f;
      iVar6 = local_48->_parseLineNum;
      local_60._flags = 0;
      local_60._start = (char *)0x0;
      local_60._end = (char *)0x0;
      iVar1 = (*local_48->_vptr_XMLNode[0x11])(local_48,pcVar3,&local_60);
      p = (char *)CONCAT44(extraout_var,iVar1);
      if (p == (char *)0x0) {
        DeleteNode(node_00);
        iVar1 = 3;
        if (this->_document->_errorID == XML_SUCCESS) {
          XMLDocument::SetError(this->_document,XML_ERROR_PARSING,iVar6,(char *)0x0);
        }
      }
      else {
        iVar1 = (*node_00->_vptr_XMLNode[4])(node_00);
        plVar4 = (long *)CONCAT44(extraout_var_00,iVar1);
        if ((plVar4 == (long *)0x0) ||
           ((iVar1 = (*this->_vptr_XMLNode[3])(), CONCAT44(extraout_var_01,iVar1) != 0 &&
            ((this->_firstChild == (XMLNode *)0x0 ||
             (((iVar1 = (*this->_firstChild->_vptr_XMLNode[4])(),
               CONCAT44(extraout_var_02,iVar1) != 0 && (this->_lastChild != (XMLNode *)0x0)) &&
              (iVar1 = (*this->_lastChild->_vptr_XMLNode[4])(), CONCAT44(extraout_var_03,iVar1) != 0
              )))))))) {
          iVar1 = (**node_00->_vptr_XMLNode)(node_00);
          plVar4 = (long *)CONCAT44(extraout_var_04,iVar1);
          if (plVar4 == (long *)0x0) {
LAB_001182af:
            iVar1 = 0;
            InsertEndChild(this,node_00);
          }
          else {
            iVar1 = (int)plVar4[0xd];
            if (iVar1 == 2) {
              if (parentEndTag != (StrPair *)0x0) {
                StrPair::TransferTo((StrPair *)(plVar4 + 3),parentEndTag);
              }
              (*node_00->_memPool->_vptr_MemPool[5])();
              iVar1 = 1;
              DeleteNode(node_00);
              local_40 = p;
            }
            else {
              if (local_60._start == local_60._end) {
                if (iVar1 != 0) goto LAB_001182af;
              }
              else if (iVar1 == 0) {
                pcVar3 = StrPair::GetStr(&local_60);
                lVar5 = (**(code **)(*plVar4 + 0x48))(plVar4);
                if (lVar5 == 0) {
                  __s2 = StrPair::GetStr((StrPair *)(plVar4 + 3));
                }
                else {
                  __s2 = (char *)0x0;
                }
                if ((pcVar3 == __s2) || (iVar1 = strncmp(pcVar3,__s2,0x7fffffff), iVar1 == 0))
                goto LAB_001182af;
              }
              pXVar2 = this->_document;
              lVar5 = (**(code **)(*plVar4 + 0x48))(plVar4);
              if (lVar5 == 0) {
                pcVar3 = StrPair::GetStr((StrPair *)(plVar4 + 3));
              }
              else {
                pcVar3 = (char *)0x0;
              }
              XMLDocument::SetError
                        (pXVar2,XML_ERROR_MISMATCHED_ELEMENT,iVar6,"XMLElement name=%s",pcVar3);
              iVar1 = 3;
              DeleteNode(node_00);
            }
          }
        }
        else {
          pXVar2 = this->_document;
          lVar5 = (**(code **)(*plVar4 + 0x48))(plVar4);
          if (lVar5 == 0) {
            pcVar3 = StrPair::GetStr((StrPair *)(plVar4 + 3));
          }
          else {
            pcVar3 = (char *)0x0;
          }
          XMLDocument::SetError
                    (pXVar2,XML_ERROR_PARSING_DECLARATION,iVar6,"XMLDeclaration value=%s",pcVar3);
          iVar1 = 3;
          DeleteNode(node_00);
        }
      }
      if (((local_60._flags & 0x200U) != 0) && (local_60._start != (char *)0x0)) {
        operator_delete__(local_60._start);
      }
    } while (iVar1 == 0);
    if (iVar1 != 3) goto LAB_00118061;
  }
LAB_0011805f:
  local_40 = (char *)0x0;
LAB_00118061:
  this_00->_parsingDepth = this_00->_parsingDepth + -1;
  return local_40;
}

Assistant:

char* XMLNode::ParseDeep( char* p, StrPair* parentEndTag, int* curLineNumPtr )
{
    // This is a recursive method, but thinking about it "at the current level"
    // it is a pretty simple flat list:
    //		<foo/>
    //		<!-- comment -->
    //
    // With a special case:
    //		<foo>
    //		</foo>
    //		<!-- comment -->
    //
    // Where the closing element (/foo) *must* be the next thing after the opening
    // element, and the names must match. BUT the tricky bit is that the closing
    // element will be read by the child.
    //
    // 'endTag' is the end tag for this node, it is returned by a call to a child.
    // 'parentEnd' is the end tag for the parent, which is filled in and returned.

	XMLDocument::DepthTracker tracker(_document);
	if (_document->Error())
		return 0;

	while( p && *p ) {
        XMLNode* node = 0;

        p = _document->Identify( p, &node );
        TIXMLASSERT( p );
        if ( node == 0 ) {
            break;
        }

       const int initialLineNum = node->_parseLineNum;

        StrPair endTag;
        p = node->ParseDeep( p, &endTag, curLineNumPtr );
        if ( !p ) {
            DeleteNode( node );
            if ( !_document->Error() ) {
                _document->SetError( XML_ERROR_PARSING, initialLineNum, 0);
            }
            break;
        }

        const XMLDeclaration* const decl = node->ToDeclaration();
        if ( decl ) {
            // Declarations are only allowed at document level
            //
            // Multiple declarations are allowed but all declarations
            // must occur before anything else. 
            //
            // Optimized due to a security test case. If the first node is 
            // a declaration, and the last node is a declaration, then only 
            // declarations have so far been added.
            bool wellLocated = false;

            if (ToDocument()) {
                if (FirstChild()) {
                    wellLocated =
                        FirstChild() &&
                        FirstChild()->ToDeclaration() &&
                        LastChild() &&
                        LastChild()->ToDeclaration();
                }
                else {
                    wellLocated = true;
                }
            }
            if ( !wellLocated ) {
                _document->SetError( XML_ERROR_PARSING_DECLARATION, initialLineNum, "XMLDeclaration value=%s", decl->Value());
                DeleteNode( node );
                break;
            }
        }

        XMLElement* ele = node->ToElement();
        if ( ele ) {
            // We read the end tag. Return it to the parent.
            if ( ele->ClosingType() == XMLElement::CLOSING ) {
                if ( parentEndTag ) {
                    ele->_value.TransferTo( parentEndTag );
                }
                node->_memPool->SetTracked();   // created and then immediately deleted.
                DeleteNode( node );
                return p;
            }

            // Handle an end tag returned to this level.
            // And handle a bunch of annoying errors.
            bool mismatch = false;
            if ( endTag.Empty() ) {
                if ( ele->ClosingType() == XMLElement::OPEN ) {
                    mismatch = true;
                }
            }
            else {
                if ( ele->ClosingType() != XMLElement::OPEN ) {
                    mismatch = true;
                }
                else if ( !XMLUtil::StringEqual( endTag.GetStr(), ele->Name() ) ) {
                    mismatch = true;
                }
            }
            if ( mismatch ) {
                _document->SetError( XML_ERROR_MISMATCHED_ELEMENT, initialLineNum, "XMLElement name=%s", ele->Name());
                DeleteNode( node );
                break;
            }
        }
        InsertEndChild( node );
    }
    return 0;
}